

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

void __thiscall HighsBasis::clear(HighsBasis *this)

{
  invalidate((HighsBasis *)0x52a118);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::clear
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)0x52a126);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::clear
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)0x52a134);
  return;
}

Assistant:

void HighsBasis::clear() {
  this->invalidate();
  this->row_status.clear();
  this->col_status.clear();
}